

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportTag
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index tag_index,Index sig_index)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  allocator<char> local_162;
  allocator<char> local_161;
  undefined1 local_160 [8];
  string_view field_name_local;
  string_view module_name_local;
  string local_138;
  TagType tag_type;
  string local_e8;
  Location loc;
  Var local_78;
  
  field_name_local._M_str = field_name._M_str;
  field_name_local._M_len = field_name._M_len;
  module_name_local._M_str = module_name._M_str;
  module_name_local._M_len = module_name._M_len;
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  tag_type.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  tag_type.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  tag_type.super_ExternType._vptr_ExternType = (_func_int **)(this->filename_)._M_len;
  tag_type.super_ExternType._8_8_ = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       tag_type.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start;
  Var::Var(&local_78,sig_index,(Location *)&tag_type);
  RVar2 = SharedValidator::OnTag(&this->validator_,&loc,&local_78);
  Var::~Var(&local_78);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    EVar3 = Ok;
    TagType::TagType(&tag_type,Exception,
                     &(this->module_->func_types).
                      super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                      ._M_impl.super__Vector_impl_data._M_start[sig_index].params);
    pMVar1 = this->module_;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_138,&module_name_local,&local_161);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_e8,&field_name_local,&local_162);
    TagType::Clone((TagType *)local_160);
    ImportType::ImportType
              ((ImportType *)&loc,&local_138,&local_e8,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_160);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&loc);
    ImportType::~ImportType((ImportType *)&loc);
    if (local_160 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_160 + 8))();
    }
    local_160 = (undefined1  [8])0x0;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::vector<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>::push_back
              (&this->tag_types_,&tag_type);
    TagType::~TagType(&tag_type);
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportTag(Index import_index,
                                       std::string_view module_name,
                                       std::string_view field_name,
                                       Index tag_index,
                                       Index sig_index) {
  CHECK_RESULT(validator_.OnTag(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  TagType tag_type{TagAttr::Exception, func_type.params};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), tag_type.Clone())});
  tag_types_.push_back(tag_type);
  return Result::Ok;
}